

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O0

void __thiscall
QAbstractScrollAreaPrivate::layoutChildren_helper
          (QAbstractScrollAreaPrivate *this,bool *needHorizontalScrollbar,
          bool *needVerticalScrollbar)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Orientation OVar7;
  QAbstractScrollArea *pQVar8;
  QStyle *pQVar9;
  qsizetype qVar10;
  const_iterator o;
  QHeaderView **ppQVar11;
  QAbstractScrollAreaScrollBarContainer **ppQVar12;
  byte *in_RDX;
  byte *in_RSI;
  QAbstractScrollAreaPrivate *in_RDI;
  long in_FS_OFFSET;
  bool bVar13;
  QRect QVar14;
  QHeaderView *header;
  QList<QHeaderView_*> *__range3;
  int hHeaderBottom;
  int vHeaderRight;
  int spacing;
  bool hasCornerWidget;
  int vsbExt;
  int hsbExt;
  int vscrollOverlap;
  bool needv;
  bool vtransient;
  int hscrollOverlap;
  bool needh;
  bool htransient;
  QAbstractScrollArea *q;
  QRect cornerWidgetRect;
  QRect verticalScrollBarRect;
  QRect horizontalScrollBarRect;
  QRect geo;
  const_iterator __end3;
  const_iterator __begin3;
  QList<QHeaderView_*> headers;
  QPoint cornerPoint;
  QRect frameRect;
  QPoint cornerExtra;
  QRect viewportRect;
  QRect controlsRect;
  QPoint cornerOffset;
  QRect widgetRect;
  QSize extSize;
  QPoint extPoint;
  QStyleOption opt;
  QStyleOptionSlider barOpt;
  int in_stack_fffffffffffffba8;
  FindChildOption in_stack_fffffffffffffbac;
  QRect *in_stack_fffffffffffffbb0;
  QStyleOption *this_00;
  QWidget *in_stack_fffffffffffffbb8;
  QAbstractScrollAreaScrollBarContainer *in_stack_fffffffffffffbc0;
  int in_stack_fffffffffffffbc8;
  int in_stack_fffffffffffffbcc;
  QAbstractScrollAreaScrollBarContainer *in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd8;
  LayoutDirection in_stack_fffffffffffffbdc;
  int in_stack_fffffffffffffbe0;
  int in_stack_fffffffffffffbe4;
  int in_stack_fffffffffffffbe8;
  QFlagsStorage<Qt::FindChildOption> in_stack_fffffffffffffbec;
  byte local_39c;
  byte local_39b;
  byte local_39a;
  byte local_399;
  byte local_393;
  byte local_392;
  byte local_391;
  byte local_381;
  int local_36c;
  QStyleOption local_320 [3];
  const_iterator local_248 [2];
  QList<QHeaderView_*> local_238;
  undefined8 local_220;
  undefined8 local_218;
  QRect local_200;
  QPoint local_1e8;
  QPoint local_1e0;
  QPoint local_1d8;
  QPalettePrivate *local_1d0;
  QPoint local_1c8;
  QPoint local_1c0;
  QPoint local_1b8;
  undefined1 local_1b0 [32];
  QRect local_190;
  QRect local_180;
  QRect local_170;
  QRect local_160;
  undefined8 local_150;
  QObject *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  undefined1 *puStack_130;
  undefined1 *local_120;
  QObject *local_118;
  QPalettePrivate *local_110;
  undefined1 local_108 [16];
  undefined1 *local_f8;
  QPalettePrivate *local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined1 local_c8 [64];
  undefined1 local_88 [128];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar8 = q_func(in_RDI);
  memcpy(local_88,&DAT_00ab2300,0x80);
  QStyleOptionSlider::QStyleOptionSlider((QStyleOptionSlider *)0x495e87);
  (**(code **)(*(long *)&(in_RDI->hbar->super_QAbstractSlider).super_QWidget + 0x1a8))
            (in_RDI->hbar,local_88);
  pQVar9 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  iVar4 = (**(code **)(*(long *)pQVar9 + 0xf0))(pQVar9,0x60,local_88,in_RDI->hbar,0);
  bVar13 = iVar4 != 0;
  local_381 = 1;
  if ((*in_RSI & 1) == 0) {
    local_391 = 0;
    if (in_RDI->hbarpolicy != ScrollBarAlwaysOff) {
      if ((in_RDI->hbarpolicy != ScrollBarAlwaysOn) || (local_392 = 1, bVar13)) {
        if ((in_RDI->hbarpolicy == ScrollBarAsNeeded) || (local_393 = 0, bVar13)) {
          iVar4 = QAbstractSlider::minimum((QAbstractSlider *)in_stack_fffffffffffffbb0);
          iVar5 = QAbstractSlider::maximum((QAbstractSlider *)in_stack_fffffffffffffbb0);
          local_393 = 0;
          if (iVar4 < iVar5) {
            local_d0 = (**(code **)(*(long *)&(in_RDI->hbar->super_QAbstractSlider).super_QWidget +
                                   0x70))();
            bVar1 = QSize::isEmpty((QSize *)in_stack_fffffffffffffbc0);
            local_393 = bVar1 ^ 0xff;
          }
        }
        local_392 = local_393;
      }
      local_391 = local_392;
    }
    local_381 = local_391;
  }
  local_381 = local_381 & 1;
  pQVar9 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  iVar4 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x56,local_88,in_RDI->hbar);
  (**(code **)(*(long *)&(in_RDI->vbar->super_QAbstractSlider).super_QWidget + 0x1a8))
            (in_RDI->vbar,local_88);
  pQVar9 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  iVar5 = (**(code **)(*(long *)pQVar9 + 0xf0))(pQVar9,0x60,local_88,in_RDI->vbar,0);
  bVar1 = iVar5 != 0;
  local_399 = 1;
  if ((*in_RDX & 1) == 0) {
    local_39a = 0;
    if (in_RDI->vbarpolicy != ScrollBarAlwaysOff) {
      if ((in_RDI->vbarpolicy != ScrollBarAlwaysOn) || (local_39b = 1, bVar1)) {
        if ((in_RDI->vbarpolicy == ScrollBarAsNeeded) || (local_39c = 0, bVar1)) {
          iVar5 = QAbstractSlider::minimum((QAbstractSlider *)in_stack_fffffffffffffbb0);
          iVar6 = QAbstractSlider::maximum((QAbstractSlider *)in_stack_fffffffffffffbb0);
          local_39c = 0;
          if (iVar5 < iVar6) {
            local_d8 = (**(code **)(*(long *)&(in_RDI->vbar->super_QAbstractSlider).super_QWidget +
                                   0x70))();
            bVar2 = QSize::isEmpty((QSize *)in_stack_fffffffffffffbc0);
            local_39c = bVar2 ^ 0xff;
          }
        }
        local_39b = local_39c;
      }
      local_39a = local_39b;
    }
    local_399 = local_39a;
  }
  local_399 = local_399 & 1;
  pQVar9 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  iVar5 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x56,local_88,in_RDI->vbar);
  memset(local_c8,0xaa,0x40);
  QStyleOption::QStyleOption
            ((QStyleOption *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
             (int)((ulong)in_stack_fffffffffffffbc0 >> 0x20),(int)in_stack_fffffffffffffbc0);
  QStyleOption::initFrom
            ((QStyleOption *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
             &in_stack_fffffffffffffbc0->super_QWidget);
  local_e0 = (**(code **)(*(long *)&(in_RDI->hbar->super_QAbstractSlider).super_QWidget + 0x70))();
  QSize::height((QSize *)0x4962c4);
  local_e8 = (**(code **)(*(long *)&(in_RDI->vbar->super_QAbstractSlider).super_QWidget + 0x70))();
  QSize::width((QSize *)0x4962f7);
  local_f0 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QPoint::QPoint((QPoint *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                 in_stack_fffffffffffffba8);
  local_f8 = &DAT_aaaaaaaaaaaaaaaa;
  QSize::QSize((QSize *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
               in_stack_fffffffffffffba8);
  local_108._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_108._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_108 = (undefined1  [16])
              QWidget::rect((QWidget *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8)
                           );
  bVar2 = in_RDI->cornerWidget != (QWidget *)0x0;
  local_110 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QPoint::QPoint((QPoint *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                 in_stack_fffffffffffffba8);
  local_120 = &DAT_aaaaaaaaaaaaaaaa;
  local_118 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  QRect::QRect(in_stack_fffffffffffffbb0);
  local_138 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_130 = &DAT_aaaaaaaaaaaaaaaa;
  QRect::QRect(in_stack_fffffffffffffbb0);
  if ((in_RDI->super_QFramePrivate).frameStyle != 0) {
    pQVar9 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8)
                           );
    iVar6 = (**(code **)(*(long *)pQVar9 + 0xf0))(pQVar9,0x11,local_c8,pQVar8,0);
    if (iVar6 != 0) {
      local_120 = (undefined1 *)local_108._0_8_;
      local_118 = (QObject *)local_108._8_8_;
      pQVar9 = QWidget::style((QWidget *)
                              CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x55,local_c8,pQVar8);
      local_140 = &DAT_aaaaaaaaaaaaaaaa;
      QPoint::QPoint((QPoint *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                     in_stack_fffffffffffffba8);
      local_150 = local_108._0_8_;
      local_148 = (QObject *)local_108._8_8_;
      QPoint::x((QPoint *)0x496617);
      QPoint::x((QPoint *)0x49662e);
      QPoint::y((QPoint *)0x49664a);
      QPoint::y((QPoint *)0x496664);
      QRect::adjust((QRect *)in_stack_fffffffffffffbc0,
                    (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),(int)in_stack_fffffffffffffbb8,
                    (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20),(int)in_stack_fffffffffffffbb0);
      local_160 = QStyle::visualRect(in_stack_fffffffffffffbdc,(QRect *)in_stack_fffffffffffffbd0,
                                     (QRect *)CONCAT44(in_stack_fffffffffffffbcc,
                                                       in_stack_fffffffffffffbc8));
      QFrame::setFrameRect
                ((QFrame *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                 (QRect *)in_stack_fffffffffffffbd0);
      local_180 = QWidget::contentsRect(in_stack_fffffffffffffbb8);
      local_170 = QStyle::visualRect(in_stack_fffffffffffffbdc,(QRect *)in_stack_fffffffffffffbd0,
                                     (QRect *)CONCAT44(in_stack_fffffffffffffbcc,
                                                       in_stack_fffffffffffffbc8));
      local_138 = (undefined1 *)local_170._0_8_;
      puStack_130 = (undefined1 *)local_170._8_8_;
      goto LAB_0049687c;
    }
  }
  local_190 = QStyle::visualRect(in_stack_fffffffffffffbdc,(QRect *)in_stack_fffffffffffffbd0,
                                 (QRect *)CONCAT44(in_stack_fffffffffffffbcc,
                                                   in_stack_fffffffffffffbc8));
  QFrame::setFrameRect
            ((QFrame *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
             (QRect *)in_stack_fffffffffffffbd0);
  local_1b0._16_16_ = (undefined1  [16])QWidget::contentsRect(in_stack_fffffffffffffbb8);
  local_120 = (undefined1 *)local_1b0._16_8_;
  local_118 = (QObject *)local_1b0._24_8_;
  local_1b8 = QRect::topLeft((QRect *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8))
  ;
  local_1c8 = QRect::bottomRight((QRect *)CONCAT44(in_stack_fffffffffffffbac,
                                                   in_stack_fffffffffffffba8));
  local_1c0 = ::operator-((QPoint *)in_stack_fffffffffffffbc0,(QPoint *)in_stack_fffffffffffffbb8);
  QRect::QRect((QRect *)in_stack_fffffffffffffbd0,
               (QPoint *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
               (QPoint *)in_stack_fffffffffffffbc0);
  local_138 = (undefined1 *)local_1b0._0_8_;
  puStack_130 = (undefined1 *)local_1b0._8_8_;
LAB_0049687c:
  QPoint::QPoint((QPoint *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                 in_stack_fffffffffffffba8);
  local_110 = local_1d0;
  if ((bVar2) && (((local_399 != 0 && (iVar5 == 0)) || ((local_381 != 0 && (iVar4 == 0)))))) {
    local_110 = local_f0;
  }
  local_1d8 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  local_1e8 = QRect::bottomRight((QRect *)CONCAT44(in_stack_fffffffffffffbac,
                                                   in_stack_fffffffffffffba8));
  QPoint::QPoint((QPoint *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                 in_stack_fffffffffffffba8);
  local_1e0 = ::operator+((QPoint *)in_stack_fffffffffffffbc0,(QPoint *)in_stack_fffffffffffffbb8);
  local_1d8 = ::operator-((QPoint *)in_stack_fffffffffffffbc0,(QPoint *)in_stack_fffffffffffffbb8);
  if ((((local_399 == 0) || (local_381 == 0)) || (bVar2)) || ((iVar4 != 0 || (iVar5 != 0)))) {
    QRect::QRect(in_stack_fffffffffffffbb0);
    (in_RDI->cornerPaintingRect).x1 = (Representation)(undefined4)local_220;
    (in_RDI->cornerPaintingRect).y1 = (Representation)local_220._4_4_;
    (in_RDI->cornerPaintingRect).x2 = (Representation)(undefined4)local_218;
    (in_RDI->cornerPaintingRect).y2 = (Representation)local_218._4_4_;
  }
  else {
    QRect::QRect((QRect *)in_stack_fffffffffffffbd0,
                 (QPoint *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                 (QSize *)in_stack_fffffffffffffbc0);
    QVar14 = QStyle::visualRect(in_stack_fffffffffffffbdc,(QRect *)in_stack_fffffffffffffbd0,
                                (QRect *)CONCAT44(in_stack_fffffffffffffbcc,
                                                  in_stack_fffffffffffffbc8));
    local_200._0_8_ = QVar14._0_8_;
    (in_RDI->cornerPaintingRect).x1 = (Representation)local_200.x1.m_i;
    (in_RDI->cornerPaintingRect).y1 = (Representation)local_200.y1.m_i;
    local_200._8_8_ = QVar14._8_8_;
    (in_RDI->cornerPaintingRect).x2 = (Representation)local_200.x2.m_i;
    (in_RDI->cornerPaintingRect).y2 = (Representation)local_200.y2.m_i;
    local_200 = QVar14;
  }
  local_36c = 0;
  if (((0 < iVar5) && (local_399 != 0)) || ((0 < iVar4 && (local_381 != 0)))) {
    local_238.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_238.d.ptr = (QHeaderView **)&DAT_aaaaaaaaaaaaaaaa;
    local_238.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QFlags<Qt::FindChildOption>::QFlags
              ((QFlags<Qt::FindChildOption> *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac);
    QObject::findChildren<QHeaderView*>
              ((QObject *)in_stack_fffffffffffffbc0,(FindChildOptions)in_stack_fffffffffffffbec.i);
    qVar10 = QList<QHeaderView_*>::size(&local_238);
    if (qVar10 < 3) {
      local_248[0].i = (QHeaderView **)&DAT_aaaaaaaaaaaaaaaa;
      local_248[0] = QList<QHeaderView_*>::begin((QList<QHeaderView_*> *)in_stack_fffffffffffffbb0);
      o = QList<QHeaderView_*>::end((QList<QHeaderView_*> *)in_stack_fffffffffffffbb0);
      while (bVar3 = QList<QHeaderView_*>::const_iterator::operator!=(local_248,o), bVar3) {
        ppQVar11 = QList<QHeaderView_*>::const_iterator::operator*(local_248);
        QWidget::geometry((QWidget *)*ppQVar11);
        OVar7 = QHeaderView::orientation((QHeaderView *)in_stack_fffffffffffffbb0);
        in_stack_fffffffffffffbec.i = in_stack_fffffffffffffbec.i & 0xffffff;
        if (OVar7 == Vertical) {
          bVar3 = QWidget::isVisible((QWidget *)0x496c7d);
          in_stack_fffffffffffffbec.i = in_stack_fffffffffffffbec.i & 0xffffff;
          if (bVar3) {
            QStyle::visualRect(in_stack_fffffffffffffbdc,(QRect *)in_stack_fffffffffffffbd0,
                               (QRect *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8
                                                ));
            in_stack_fffffffffffffbe8 = QRect::left((QRect *)0x496cc9);
            iVar4 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffbac,
                                                   in_stack_fffffffffffffba8));
            in_stack_fffffffffffffbec.i =
                 CONCAT13(in_stack_fffffffffffffbe8 <= iVar4 / 2,(int3)in_stack_fffffffffffffbec.i);
          }
        }
        if ((char)(in_stack_fffffffffffffbec.i >> 0x18) == '\0') {
          OVar7 = QHeaderView::orientation((QHeaderView *)in_stack_fffffffffffffbb0);
          if ((OVar7 == Horizontal) && (bVar3 = QWidget::isVisible((QWidget *)0x496d64), bVar3)) {
            in_stack_fffffffffffffbe4 = QRect::top((QRect *)0x496d77);
            iVar4 = QFrame::frameWidth((QFrame *)in_stack_fffffffffffffbb0);
            if (in_stack_fffffffffffffbe4 <= iVar4) {
              QRect::bottom((QRect *)0x496d9f);
            }
          }
        }
        else {
          QStyle::visualRect(in_stack_fffffffffffffbdc,(QRect *)in_stack_fffffffffffffbd0,
                             (QRect *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8))
          ;
          local_36c = QRect::right((QRect *)0x496d3c);
        }
        QList<QHeaderView_*>::const_iterator::operator++(local_248);
      }
    }
    QList<QHeaderView_*>::~QList((QList<QHeaderView_*> *)0x496dcb);
  }
  if (local_381 != 0) {
    iVar4 = QRect::left((QRect *)0x496e04);
    in_stack_fffffffffffffbdc = iVar4 + local_36c;
    QPoint::y((QPoint *)0x496e1c);
    QPoint::QPoint((QPoint *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                   in_stack_fffffffffffffba8);
    in_stack_fffffffffffffbe0 = QPoint::x((QPoint *)0x496e3c);
    in_stack_fffffffffffffbe0 = in_stack_fffffffffffffbe0 + -1;
    QRect::bottom((QRect *)0x496e50);
    QPoint::QPoint((QPoint *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                   in_stack_fffffffffffffba8);
    QRect::QRect((QRect *)in_stack_fffffffffffffbd0,
                 (QPoint *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                 (QPoint *)in_stack_fffffffffffffbc0);
    if ((!bVar2) && (bVar13)) {
      QPoint::x((QPoint *)0x496ea1);
      QRect::adjust((QRect *)in_stack_fffffffffffffbc0,
                    (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),(int)in_stack_fffffffffffffbb8,
                    (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20),(int)in_stack_fffffffffffffbb0);
    }
    ppQVar12 = QHVContainer<QAbstractScrollAreaScrollBarContainer_*>::operator[]
                         ((QHVContainer<QAbstractScrollAreaScrollBarContainer_*> *)
                          in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac);
    in_stack_fffffffffffffbd0 = *ppQVar12;
    QStyle::visualRect(in_stack_fffffffffffffbdc,(QRect *)in_stack_fffffffffffffbd0,
                       (QRect *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    QWidget::setGeometry
              ((QWidget *)CONCAT44(in_stack_fffffffffffffbec.i,in_stack_fffffffffffffbe8),
               (QRect *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
    iVar4 = 1;
    ppQVar12 = QHVContainer<QAbstractScrollAreaScrollBarContainer_*>::operator[]
                         ((QHVContainer<QAbstractScrollAreaScrollBarContainer_*> *)
                          in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac);
    QWidget::raise(&(*ppQVar12)->super_QWidget,iVar4);
  }
  if (local_399 != 0) {
    in_stack_fffffffffffffbc8 = QPoint::x((QPoint *)0x496f76);
    QRect::top((QRect *)0x496f87);
    QPoint::QPoint((QPoint *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                   in_stack_fffffffffffffba8);
    in_stack_fffffffffffffbcc = QRect::right((QRect *)0x496fae);
    QPoint::y((QPoint *)0x496fbf);
    QPoint::QPoint((QPoint *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                   in_stack_fffffffffffffba8);
    QRect::QRect((QRect *)in_stack_fffffffffffffbd0,
                 (QPoint *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                 (QPoint *)in_stack_fffffffffffffbc0);
    if ((!bVar2) && (bVar1)) {
      QPoint::y((QPoint *)0x497013);
      QRect::adjust((QRect *)in_stack_fffffffffffffbc0,
                    (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),(int)in_stack_fffffffffffffbb8,
                    (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20),(int)in_stack_fffffffffffffbb0);
    }
    ppQVar12 = QHVContainer<QAbstractScrollAreaScrollBarContainer_*>::operator[]
                         ((QHVContainer<QAbstractScrollAreaScrollBarContainer_*> *)
                          in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac);
    in_stack_fffffffffffffbc0 = *ppQVar12;
    QStyle::visualRect(in_stack_fffffffffffffbdc,(QRect *)in_stack_fffffffffffffbd0,
                       (QRect *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    QWidget::setGeometry
              ((QWidget *)CONCAT44(in_stack_fffffffffffffbec.i,in_stack_fffffffffffffbe8),
               (QRect *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
    iVar4 = 2;
    ppQVar12 = QHVContainer<QAbstractScrollAreaScrollBarContainer_*>::operator[]
                         ((QHVContainer<QAbstractScrollAreaScrollBarContainer_*> *)
                          in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac);
    QWidget::raise(&(*ppQVar12)->super_QWidget,iVar4);
  }
  if (in_RDI->cornerWidget != (QWidget *)0x0) {
    QRect::bottomRight((QRect *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    QRect::QRect((QRect *)in_stack_fffffffffffffbd0,
                 (QPoint *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                 (QPoint *)in_stack_fffffffffffffbc0);
    in_stack_fffffffffffffbb8 = in_RDI->cornerWidget;
    QStyle::visualRect(in_stack_fffffffffffffbdc,(QRect *)in_stack_fffffffffffffbd0,
                       (QRect *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    QWidget::setGeometry
              ((QWidget *)CONCAT44(in_stack_fffffffffffffbec.i,in_stack_fffffffffffffbe8),
               (QRect *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
  }
  ppQVar12 = QHVContainer<QAbstractScrollAreaScrollBarContainer_*>::operator[]
                       ((QHVContainer<QAbstractScrollAreaScrollBarContainer_*> *)
                        in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac);
  (**(code **)(*(long *)&(*ppQVar12)->super_QWidget + 0x68))(*ppQVar12,local_381);
  ppQVar12 = QHVContainer<QAbstractScrollAreaScrollBarContainer_*>::operator[]
                       ((QHVContainer<QAbstractScrollAreaScrollBarContainer_*> *)
                        in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac);
  (**(code **)(*(long *)&(*ppQVar12)->super_QWidget + 0x68))(*ppQVar12,local_399);
  bVar13 = QWidget::isRightToLeft((QWidget *)0x4971d4);
  iVar4 = (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20);
  iVar5 = (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20);
  if (bVar13) {
    QRect::adjust((QRect *)in_stack_fffffffffffffbc0,iVar5,(int)in_stack_fffffffffffffbb8,iVar4,
                  (int)in_stack_fffffffffffffbb0);
  }
  else {
    QRect::adjust((QRect *)in_stack_fffffffffffffbc0,iVar5,(int)in_stack_fffffffffffffbb8,iVar4,
                  (int)in_stack_fffffffffffffbb0);
  }
  this_00 = (QStyleOption *)&local_138;
  QVar14 = QStyle::visualRect(in_stack_fffffffffffffbdc,(QRect *)in_stack_fffffffffffffbd0,
                              (QRect *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8)
                             );
  local_320[0]._0_8_ = QVar14._0_8_;
  local_320[0]._8_8_ = QVar14._8_8_;
  local_138 = (undefined1 *)local_320[0]._0_8_;
  puStack_130 = (undefined1 *)local_320[0]._8_8_;
  ::operator-((QPoint *)this_00);
  QRect::translate((QRect *)this_00,
                   (QPoint *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  QWidget::setGeometry
            ((QWidget *)CONCAT44(in_stack_fffffffffffffbec.i,in_stack_fffffffffffffbe8),
             (QRect *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
  *in_RSI = local_381;
  *in_RDX = local_399;
  QStyleOption::~QStyleOption(this_00);
  QStyleOptionSlider::~QStyleOptionSlider((QStyleOptionSlider *)0x49730c);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractScrollAreaPrivate::layoutChildren_helper(bool *needHorizontalScrollbar, bool *needVerticalScrollbar)
{
    Q_Q(QAbstractScrollArea);
    QStyleOptionSlider barOpt;

    hbar->initStyleOption(&barOpt);
    bool htransient = hbar->style()->styleHint(QStyle::SH_ScrollBar_Transient, &barOpt, hbar);
    bool needh = *needHorizontalScrollbar || ((hbarpolicy != Qt::ScrollBarAlwaysOff) && ((hbarpolicy == Qt::ScrollBarAlwaysOn && !htransient)
                            || ((hbarpolicy == Qt::ScrollBarAsNeeded || htransient)
                            && hbar->minimum() < hbar->maximum() && !hbar->sizeHint().isEmpty())));
    const int hscrollOverlap = hbar->style()->pixelMetric(QStyle::PM_ScrollView_ScrollBarOverlap, &barOpt, hbar);

    vbar->initStyleOption(&barOpt);
    bool vtransient = vbar->style()->styleHint(QStyle::SH_ScrollBar_Transient, &barOpt, vbar);
    bool needv = *needVerticalScrollbar || ((vbarpolicy != Qt::ScrollBarAlwaysOff) && ((vbarpolicy == Qt::ScrollBarAlwaysOn && !vtransient)
                            || ((vbarpolicy == Qt::ScrollBarAsNeeded || vtransient)
                            && vbar->minimum() < vbar->maximum() && !vbar->sizeHint().isEmpty())));
    const int vscrollOverlap = vbar->style()->pixelMetric(QStyle::PM_ScrollView_ScrollBarOverlap, &barOpt, vbar);

    QStyleOption opt(0);
    opt.initFrom(q);

    const int hsbExt = hbar->sizeHint().height();
    const int vsbExt = vbar->sizeHint().width();
    const QPoint extPoint(vsbExt, hsbExt);
    const QSize extSize(vsbExt, hsbExt);

    const QRect widgetRect = q->rect();

    const bool hasCornerWidget = (cornerWidget != nullptr);

    QPoint cornerOffset((needv && vscrollOverlap == 0) ? vsbExt : 0, (needh && hscrollOverlap == 0) ? hsbExt : 0);
    QRect controlsRect;
    QRect viewportRect;

    // In FrameOnlyAroundContents mode the frame is drawn between the controls and
    // the viewport, else the frame rect is equal to the widget rect.
    if ((frameStyle != QFrame::NoFrame) &&
        q->style()->styleHint(QStyle::SH_ScrollView_FrameOnlyAroundContents, &opt, q)) {
        controlsRect = widgetRect;
        const int spacing = q->style()->pixelMetric(QStyle::PM_ScrollView_ScrollBarSpacing, &opt, q);
        const QPoint cornerExtra(needv ? spacing + vscrollOverlap : 0, needh ? spacing + hscrollOverlap : 0);
        QRect frameRect = widgetRect;
        frameRect.adjust(0, 0, -cornerOffset.x() - cornerExtra.x(), -cornerOffset.y() - cornerExtra.y());
        q->setFrameRect(QStyle::visualRect(opt.direction, opt.rect, frameRect));
        // The frame rect needs to be in logical coords, however we need to flip
        // the contentsRect back before passing it on to the viewportRect
        // since the viewportRect has its logical coords calculated later.
        viewportRect = QStyle::visualRect(opt.direction, opt.rect, q->contentsRect());
    } else {
        q->setFrameRect(QStyle::visualRect(opt.direction, opt.rect, widgetRect));
        controlsRect = q->contentsRect();
        viewportRect = QRect(controlsRect.topLeft(), controlsRect.bottomRight() - cornerOffset);
    }

    cornerOffset = QPoint(needv ? vsbExt : 0, needh ? hsbExt : 0);

    // If we have a corner widget and are only showing one scroll bar, we need to move it
    // to make room for the corner widget.
    if (hasCornerWidget && ((needv && vscrollOverlap == 0) || (needh && hscrollOverlap == 0)))
        cornerOffset =  extPoint;

    // The corner point is where the scroll bar rects, the corner widget rect and the
    // viewport rect meets.
    const QPoint cornerPoint(controlsRect.bottomRight() + QPoint(1, 1) - cornerOffset);

    // Some styles paints the corner if both scorllbars are showing and there is
    // no corner widget.
    if (needv && needh && !hasCornerWidget && hscrollOverlap == 0 && vscrollOverlap == 0)
        cornerPaintingRect = QStyle::visualRect(opt.direction, opt.rect, QRect(cornerPoint, extSize));
    else
        cornerPaintingRect = QRect();

    // move the scrollbars away from top/left headers
    int vHeaderRight = 0;
    int hHeaderBottom = 0;
#if QT_CONFIG(itemviews)
    if ((vscrollOverlap > 0 && needv) || (hscrollOverlap > 0 && needh)) {
        const QList<QHeaderView *> headers = q->findChildren<QHeaderView*>();
        if (headers.size() <= 2) {
            for (const QHeaderView *header : headers) {
                const QRect geo = header->geometry();
                if (header->orientation() == Qt::Vertical && header->isVisible() && QStyle::visualRect(opt.direction, opt.rect, geo).left() <= opt.rect.width() / 2)
                    vHeaderRight = QStyle::visualRect(opt.direction, opt.rect, geo).right();
                else if (header->orientation() == Qt::Horizontal && header->isVisible() && geo.top() <= q->frameWidth())
                    hHeaderBottom = geo.bottom();
             }
         }
    }
#endif // QT_CONFIG(itemviews)
    if (needh) {
        QRect horizontalScrollBarRect(QPoint(controlsRect.left() + vHeaderRight, cornerPoint.y()), QPoint(cornerPoint.x() - 1, controlsRect.bottom()));

        if (!hasCornerWidget && htransient)
            horizontalScrollBarRect.adjust(0, 0, cornerOffset.x(), 0);
        scrollBarContainers[Qt::Horizontal]->setGeometry(QStyle::visualRect(opt.direction, opt.rect, horizontalScrollBarRect));
        scrollBarContainers[Qt::Horizontal]->raise();
    }

    if (needv) {
        QRect verticalScrollBarRect  (QPoint(cornerPoint.x(), controlsRect.top() + hHeaderBottom),  QPoint(controlsRect.right(), cornerPoint.y() - 1));
        if (!hasCornerWidget && vtransient)
            verticalScrollBarRect.adjust(0, 0, 0, cornerOffset.y());
        scrollBarContainers[Qt::Vertical]->setGeometry(QStyle::visualRect(opt.direction, opt.rect, verticalScrollBarRect));
        scrollBarContainers[Qt::Vertical]->raise();
    }

    if (cornerWidget) {
        const QRect cornerWidgetRect(cornerPoint, controlsRect.bottomRight());
        cornerWidget->setGeometry(QStyle::visualRect(opt.direction, opt.rect, cornerWidgetRect));
    }

    scrollBarContainers[Qt::Horizontal]->setVisible(needh);
    scrollBarContainers[Qt::Vertical]->setVisible(needv);

    if (q->isRightToLeft())
        viewportRect.adjust(right, top, -left, -bottom);
    else
        viewportRect.adjust(left, top, -right, -bottom);
    viewportRect = QStyle::visualRect(opt.direction, opt.rect, viewportRect);
    viewportRect.translate(-overshoot);
    viewport->setGeometry(viewportRect); // resize the viewport last

    *needHorizontalScrollbar = needh;
    *needVerticalScrollbar = needv;
}